

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_aio_reset(nni_aio *aio)

{
  uint local_14;
  uint i;
  nni_aio *aio_local;
  
  aio->a_result = NNG_OK;
  aio->a_count = 0;
  aio->a_abort = false;
  aio->a_expire_ok = false;
  aio->a_sleep = false;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    aio->a_outputs[local_14] = (void *)0x0;
  }
  return;
}

Assistant:

void
nni_aio_reset(nni_aio *aio)
{
	aio->a_result    = NNG_OK;
	aio->a_count     = 0;
	aio->a_abort     = false;
	aio->a_expire_ok = false;
	aio->a_sleep     = false;

	for (unsigned i = 0; i < NNI_NUM_ELEMENTS(aio->a_outputs); i++) {
		aio->a_outputs[i] = NULL;
	}
}